

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unix-init.c
# Opt level: O2

int lws_plat_init(lws_context *context,lws_context_creation_info *info)

{
  uint uVar1;
  lws **pplVar2;
  lws_log_cx *cx;
  lws_usec_t lVar3;
  uint *puVar4;
  int iVar5;
  undefined8 in_stack_ffffffffffffffd8;
  undefined4 uVar6;
  
  uVar6 = (undefined4)((ulong)in_stack_ffffffffffffffd8 >> 0x20);
  pplVar2 = (lws **)lws_zalloc((ulong)context->max_fds << 3,"lws_lookup");
  context->lws_lookup = pplVar2;
  cx = lwsl_context_get_cx(context);
  if (pplVar2 == (lws **)0x0) {
    iVar5 = 1;
    _lws_log_cx(cx,lws_log_prepend_context,context,1,"lws_plat_init",
                "OOM on alloc lws_lookup array for %d conn",CONCAT44(uVar6,context->max_fds));
  }
  else {
    iVar5 = 0;
    _lws_log_cx(cx,lws_log_prepend_context,context,8,"lws_plat_init"," mem: platform fd map: %5lu B"
                ,(ulong)context->max_fds << 3);
    uVar1 = lws_open("/dev/urandom",0);
    context->fd_random = uVar1;
    if ((int)uVar1 < 0) {
      puVar4 = (uint *)__errno_location();
      iVar5 = 1;
      _lws_log(1,"Unable to open random device %s %d, errno %d\n","/dev/urandom",(ulong)uVar1,
               (ulong)*puVar4);
    }
    else {
      context->pt[0].sul_plat.cb = lws_sul_plat_unix;
      lVar3 = lws_now_usecs();
      context->pt[0].sul_plat.us = lVar3 + 30000000;
      __lws_sul_insert(context->pt[0].pt_sul_owner,&context->pt[0].sul_plat);
    }
  }
  return iVar5;
}

Assistant:

int
lws_plat_init(struct lws_context *context,
	      const struct lws_context_creation_info *info)
{
	int fd;
#if defined(LWS_WITH_NETWORK)
	/*
	 * context has the process-global fd lookup array.  This can be
	 * done two different ways now; one or the other is done depending on if
	 * info->fd_limit_per_thread was snonzero
	 *
	 *  - default: allocate a worst-case lookup array sized for ulimit -n
	 *             and use the fd directly as an index into it
	 *
	 *  - slow:    allocate context->max_fds entries only (which can be
	 *             forced at context creation time to be
	 *             info->fd_limit_per_thread * the number of threads)
	 *             and search the array to lookup fds
	 *
	 * the default way is optimized for server, if you only use one or two
	 * client wsi the slow way may save a lot of memory.
	 *
	 * Both ways allocate an array of struct lws *... one allocates it for
	 * all possible fd indexes the process could produce and uses it as a
	 * map, the other allocates for an amount of wsi the lws context is
	 * expected to use and searches through it to manipulate it.
	 */

	context->lws_lookup = lws_zalloc(sizeof(struct lws *) *
					 context->max_fds, "lws_lookup");

	if (!context->lws_lookup) {
		lwsl_cx_err(context, "OOM on alloc lws_lookup array for %d conn",
			 context->max_fds);
		return 1;
	}

#if defined(LWS_WITH_MBEDTLS)
	{
		int n;

		/* initialize platform random through mbedtls */
		mbedtls_entropy_init(&context->mec);
		mbedtls_ctr_drbg_init(&context->mcdc);

		n = mbedtls_ctr_drbg_seed(&context->mcdc, mbedtls_entropy_func,
					  &context->mec, NULL, 0);
		if (n)
			lwsl_err("%s: mbedtls_ctr_drbg_seed() returned 0x%x\n",
				 __func__, n);
#if 0
		else {
			uint8_t rtest[16];
			lwsl_notice("%s: started drbg\n", __func__);
			if (mbedtls_ctr_drbg_random(&context->mcdc, rtest,
							sizeof(rtest)))
				lwsl_err("%s: get random failed\n", __func__);
			else
				lwsl_hexdump_notice(rtest, sizeof(rtest));
		}
#endif
	}
#endif

	lwsl_cx_info(context, " mem: platform fd map: %5lu B",
		    (unsigned long)(sizeof(struct lws *) * context->max_fds));
#endif
#if defined(LWS_WITH_FILE_OPS)
	fd = lws_open(SYSTEM_RANDOM_FILEPATH, O_RDONLY);
#else
	fd = open(SYSTEM_RANDOM_FILEPATH, O_RDONLY);
#endif
	context->fd_random = fd;
	if (context->fd_random < 0) {
		lwsl_err("Unable to open random device %s %d, errno %d\n",
			 SYSTEM_RANDOM_FILEPATH, context->fd_random, errno);
		return 1;
	}

#if defined(LWS_WITH_PLUGINS)
	{
		char *ld_env = getenv("LD_LIBRARY_PATH");

		if (ld_env) {
			const char *pp[2] = { ld_env, NULL };

			lws_plugins_init(&context->plugin_list, pp,
					 "lws_protocol_plugin", NULL,
					 protocol_plugin_cb, context);
		}

		if (info->plugin_dirs)
			lws_plugins_init(&context->plugin_list,
					 info->plugin_dirs,
					 "lws_protocol_plugin", NULL,
					 protocol_plugin_cb, context);
	}
#endif


#if defined(LWS_WITH_NETWORK)
	/* we only need to do this on pt[0] */

	context->pt[0].sul_plat.cb = lws_sul_plat_unix;
	__lws_sul_insert_us(&context->pt[0].pt_sul_owner[LWSSULLI_MISS_IF_SUSPENDED],
			    &context->pt[0].sul_plat, 30 * LWS_US_PER_SEC);
#endif

	return 0;
}